

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

double __thiscall ddd::DictionaryMLT<false,_true>::ratio_singles(DictionaryMLT<false,_true> *this)

{
  long *plVar1;
  long *plVar2;
  uint32_t uVar3;
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  *subtrie;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar3 = DaTrie<false,_true,_true>::num_singles(*(DaTrie<false,_true,_true> **)(this + 8));
  uVar6 = (ulong)uVar3;
  plVar4 = *(long **)(this + 8);
  uVar5 = (ulong)(uint)((int)((ulong)(plVar4[1] - *plVar4) >> 3) - *(int *)((long)plVar4 + 100));
  plVar1 = *(long **)(this + 0x18);
  for (plVar4 = *(long **)(this + 0x10); plVar4 != plVar1; plVar4 = plVar4 + 1) {
    if ((DaTrie<false,_true,_false> *)*plVar4 != (DaTrie<false,_true,_false> *)0x0) {
      uVar3 = DaTrie<false,_true,_false>::num_singles((DaTrie<false,_true,_false> *)*plVar4);
      uVar6 = uVar6 + uVar3;
      plVar2 = (long *)*plVar4;
      uVar5 = uVar5 + (uint)((int)((ulong)(plVar2[1] - *plVar2) >> 3) - *(int *)((long)plVar2 + 100)
                            );
    }
  }
  auVar7._8_4_ = (int)(uVar6 >> 0x20);
  auVar7._0_8_ = uVar6;
  auVar7._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)(uVar5 >> 0x20);
  auVar8._0_8_ = uVar5;
  auVar8._12_4_ = 0x45300000;
  return ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
}

Assistant:

double ratio_singles() const { // not in constant time
    size_t num_singles = prefix_subtrie_->num_singles();
    size_t num_nodes = prefix_subtrie_->num_nodes();
    for (auto &subtrie : suffix_subtries_) {
      if (!subtrie) {
        continue;
      }
      num_singles += subtrie->num_singles();
      num_nodes += subtrie->num_nodes();
    }
    return static_cast<double>(num_singles) / num_nodes;
  }